

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-a64.c
# Opt level: O2

TCGv_i32 do_reduction_op(DisasContext_conflict1 *s,int fpopcode,int rn,int esize,int size,int vmap,
                        TCGv_ptr fpst)

{
  TCGContext_conflict1 *tcg_ctx;
  TCGv_i32 arg2;
  TCGv_i32 arg1;
  TCGv_i32 retval;
  byte bVar1;
  uint uVar2;
  
  tcg_ctx = s->uc->tcg_ctx;
  if (esize == size) {
    bVar1 = (byte)vmap - 1;
    if ((byte)((byte)vmap ^ bVar1) <= bVar1) {
      __assert_fail("ctpop8(vmap) == 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/translate-a64.c"
                    ,0x1cf9,
                    "TCGv_i32 do_reduction_op(DisasContext *, int, int, int, int, int, TCGv_ptr)");
    }
    if (vmap == 0) {
      uVar2 = 0x20;
    }
    else {
      uVar2 = 0;
      if (vmap != 0) {
        for (; ((uint)vmap >> uVar2 & 1) == 0; uVar2 = uVar2 + 1) {
        }
      }
    }
    if (7 < uVar2) {
      __assert_fail("element < 8",
                    "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/translate-a64.c"
                    ,0x1cfb,
                    "TCGv_i32 do_reduction_op(DisasContext *, int, int, int, int, int, TCGv_ptr)");
    }
    retval = tcg_temp_new_i32(tcg_ctx);
    read_vec_element_i32(s,retval,rn,uVar2,(esize != 0x10) + MO_16);
  }
  else {
    uVar2 = vmap >> (byte)(((vmap & 0xffU) * 0x8040201 >> 3 & 0x11111111) * 0x11111111 >> 0x1d) &
            vmap;
    arg2 = do_reduction_op(s,fpopcode,rn,esize,(uint)size >> 1,vmap ^ uVar2,fpst);
    arg1 = do_reduction_op(s,fpopcode,rn,esize,(uint)size >> 1,uVar2,fpst);
    retval = tcg_temp_new_i32(tcg_ctx);
    if (fpopcode == 0x3f) {
      gen_helper_vfp_mins(tcg_ctx,retval,arg1,arg2,fpst);
    }
    else if (fpopcode == 0xf) {
      gen_helper_advsimd_maxh(tcg_ctx,retval,arg1,arg2,fpst);
    }
    else if (fpopcode == 0x1c) {
      gen_helper_advsimd_minnumh(tcg_ctx,retval,arg1,arg2,fpst);
    }
    else if (fpopcode == 0x1f) {
      gen_helper_advsimd_minh(tcg_ctx,retval,arg1,arg2,fpst);
    }
    else if (fpopcode == 0x2c) {
      gen_helper_vfp_maxnums(tcg_ctx,retval,arg1,arg2,fpst);
    }
    else if (fpopcode == 0x2f) {
      gen_helper_vfp_maxs(tcg_ctx,retval,arg1,arg2,fpst);
    }
    else if (fpopcode == 0x3c) {
      gen_helper_vfp_minnums(tcg_ctx,retval,arg1,arg2,fpst);
    }
    else {
      if (fpopcode != 0xc) {
        g_assertion_message_expr
                  ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/translate-a64.c"
                   ,0x1d25,(char *)0x0);
      }
      gen_helper_advsimd_maxnumh(tcg_ctx,retval,arg1,arg2,fpst);
    }
    tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(arg2 + (long)tcg_ctx));
    tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(arg1 + (long)tcg_ctx));
  }
  return retval;
}

Assistant:

static TCGv_i32 do_reduction_op(DisasContext *s, int fpopcode, int rn,
                                int esize, int size, int vmap, TCGv_ptr fpst)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    if (esize == size) {
        int element;
        MemOp msize = esize == 16 ? MO_16 : MO_32;
        TCGv_i32 tcg_elem;

        /* We should have one register left here */
        assert(ctpop8(vmap) == 1);
        element = ctz32(vmap);
        assert(element < 8);

        tcg_elem = tcg_temp_new_i32(tcg_ctx);
        read_vec_element_i32(s, tcg_elem, rn, element, msize);
        return tcg_elem;
    } else {
        int bits = size / 2;
        int shift = ctpop8(vmap) / 2;
        int vmap_lo = (vmap >> shift) & vmap;
        int vmap_hi = (vmap & ~vmap_lo);
        TCGv_i32 tcg_hi, tcg_lo, tcg_res;

        tcg_hi = do_reduction_op(s, fpopcode, rn, esize, bits, vmap_hi, fpst);
        tcg_lo = do_reduction_op(s, fpopcode, rn, esize, bits, vmap_lo, fpst);
        tcg_res = tcg_temp_new_i32(tcg_ctx);

        switch (fpopcode) {
        case 0x0c: /* fmaxnmv half-precision */
            gen_helper_advsimd_maxnumh(tcg_ctx, tcg_res, tcg_lo, tcg_hi, fpst);
            break;
        case 0x0f: /* fmaxv half-precision */
            gen_helper_advsimd_maxh(tcg_ctx, tcg_res, tcg_lo, tcg_hi, fpst);
            break;
        case 0x1c: /* fminnmv half-precision */
            gen_helper_advsimd_minnumh(tcg_ctx, tcg_res, tcg_lo, tcg_hi, fpst);
            break;
        case 0x1f: /* fminv half-precision */
            gen_helper_advsimd_minh(tcg_ctx, tcg_res, tcg_lo, tcg_hi, fpst);
            break;
        case 0x2c: /* fmaxnmv */
            gen_helper_vfp_maxnums(tcg_ctx, tcg_res, tcg_lo, tcg_hi, fpst);
            break;
        case 0x2f: /* fmaxv */
            gen_helper_vfp_maxs(tcg_ctx, tcg_res, tcg_lo, tcg_hi, fpst);
            break;
        case 0x3c: /* fminnmv */
            gen_helper_vfp_minnums(tcg_ctx, tcg_res, tcg_lo, tcg_hi, fpst);
            break;
        case 0x3f: /* fminv */
            gen_helper_vfp_mins(tcg_ctx, tcg_res, tcg_lo, tcg_hi, fpst);
            break;
        default:
            g_assert_not_reached();
        }

        tcg_temp_free_i32(tcg_ctx, tcg_hi);
        tcg_temp_free_i32(tcg_ctx, tcg_lo);
        return tcg_res;
    }
}